

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

KeyValues * __thiscall KV::KeyValues::createKey(KeyValues *this,string_view *name)

{
  bool bVar1;
  pointer ppVar2;
  type pKVar3;
  KeyValues *kv;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
  local_20;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unique_ptr<KeyValues>_>_>::value,_iterator>
  it;
  string_view *name_local;
  KeyValues *this_local;
  
  it._M_node = (_Base_ptr)name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,name,&local_69);
  std::make_unique<KV::KeyValues>();
  std::
  make_pair<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>
            (&local_48,&local_68,
             (unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_> *)&kv);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
       ::
       insert<std::pair<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>
                 ((multimap<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
                   *)&this->keyvalues,&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  ::~pair(&local_48);
  std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::~unique_ptr
            ((unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_> *)&kv);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
           ::operator->(&local_20);
  pKVar3 = std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::operator*
                     (&ppVar2->second);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
           ::operator->(&local_20);
  pKVar3->key = &ppVar2->first;
  pKVar3->parentKV = this;
  bVar1 = isRoot(this);
  if (!bVar1) {
    pKVar3->depth = this->depth + 1;
  }
  return pKVar3;
}

Assistant:

KeyValues &KeyValues::createKey( const std::string_view &name )
	{
		auto it = keyvalues.insert( std::make_pair( std::string( name ), std::make_unique< KeyValues >() ) );
		KeyValues &kv = *it->second;
		kv.key = &it->first;
		kv.parentKV = this;

		if ( !isRoot() )
			kv.depth = depth + 1;

		return kv;
	}